

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void swrenderer::R_DrawPSprite
               (DPSprite *pspr,AActor *owner,float bobx,float boby,double wx,double wy,
               double ticfrac)

{
  byte bVar1;
  ushort uVar2;
  BYTE *pBVar3;
  lighttable_t *plVar4;
  FDynamicColormap *pFVar5;
  vissprite_t *pvVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int32_t iVar11;
  int iVar12;
  fixed_t fVar13;
  spritedef_t *psVar14;
  AActor *p;
  AInventory *pAVar15;
  FSpecialColormap *pFVar16;
  FState *pFVar17;
  vispsp_t *pvVar18;
  double dVar19;
  BYTE *local_108;
  BYTE *local_100;
  int local_f8;
  int32_t local_f4;
  anon_struct_4_4_2fae93b2_for_FRenderStyle_0 local_dc;
  lighttable_t *plStack_d8;
  FRenderStyle style;
  lighttable_t *oldcolormap;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_c8;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 local_c4;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_c0;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 local_bc;
  FDynamicColormap *local_b8;
  FDynamicColormap *mybasecolormap;
  FDynamicColormap *pFStack_a8;
  INTBOOL invertcolormap;
  FDynamicColormap *colormap_to_use;
  AWeapon *weapon;
  byte local_81;
  vissprite_t *pvStack_80;
  bool noaccel;
  vissprite_t *vis;
  FTexture *tex;
  WORD flip;
  spriteframe_t *psStack_68;
  FTextureID picnum;
  spriteframe_t *sprframe;
  spritedef_t *sprdef;
  double sy;
  double sx;
  int x2;
  int x1;
  double tx;
  double ticfrac_local;
  double wy_local;
  double wx_local;
  float boby_local;
  float bobx_local;
  AActor *owner_local;
  DPSprite *pspr_local;
  
  FTextureID::FTextureID((FTextureID *)((long)&tex + 4));
  if ((R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis == '\0') &&
     (iVar8 = __cxa_guard_acquire(&R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)
                                   ::avis), iVar8 != 0)) {
    TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::TArray(&R_DrawPSprite::avis);
    __cxa_atexit(TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::~TArray,
                 &R_DrawPSprite::avis,&__dso_handle);
    __cxa_guard_release(&R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis);
  }
  uVar9 = TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::Size(&R_DrawPSprite::avis);
  if (uVar9 < vispspindex + 1) {
    uVar9 = TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::Size(&R_DrawPSprite::avis);
    TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::Reserve
              (&R_DrawPSprite::avis,(uVar9 - vispspindex) + 1);
  }
  uVar9 = DPSprite::GetSprite(pspr);
  uVar10 = TArray<spritedef_t,_spritedef_t>::Size(&sprites);
  if (uVar10 <= uVar9) {
    uVar9 = DPSprite::GetSprite(pspr);
    DPrintf(1,"R_DrawPSprite: invalid sprite number %i\n",(ulong)uVar9);
    return;
  }
  iVar8 = DPSprite::GetSprite(pspr);
  psVar14 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)iVar8);
  iVar8 = DPSprite::GetFrame(pspr);
  if ((int)(uint)psVar14->numframes <= iVar8) {
    uVar9 = DPSprite::GetSprite(pspr);
    uVar10 = DPSprite::GetFrame(pspr);
    DPrintf(1,"R_DrawPSprite: invalid sprite frame %i : %i\n",(ulong)uVar9,(ulong)uVar10);
    return;
  }
  uVar2 = psVar14->spriteframes;
  iVar8 = DPSprite::GetFrame(pspr);
  psStack_68 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                         (&SpriteFrames,(long)(int)((uint)uVar2 + iVar8));
  weapon._0_4_ = psStack_68->Texture[0].texnum;
  tex._2_2_ = psStack_68->Flip & 1;
  tex._4_4_ = weapon._0_4_;
  vis = (vissprite_t *)FTextureManager::operator()(&TexMan,weapon._0_4_,false);
  if (*(BYTE *)&vis->deltax == '\r') {
    return;
  }
  if ((pspr->firstTic & 1U) != 0) {
    pspr->firstTic = false;
    pspr->oldx = pspr->x;
    pspr->oldy = pspr->y;
  }
  sy = pspr->oldx + (pspr->x - pspr->oldx) * ticfrac;
  sprdef = (spritedef_t *)(pspr->oldy + (pspr->y - pspr->oldy) * ticfrac + 0.375);
  if ((pspr->Flags & 2U) != 0) {
    sy = (double)bobx + sy;
    sprdef = (spritedef_t *)((double)boby + (double)sprdef);
  }
  if (((pspr->Flags & 1U) != 0) && (iVar8 = DPSprite::GetID(pspr), iVar8 != 1)) {
    sy = wx + sy;
    sprdef = (spritedef_t *)(wy + (double)sprdef);
  }
  iVar8 = FTexture::GetScaledLeftOffset((FTexture *)vis);
  dVar19 = (sy - 160.0) - (double)iVar8;
  iVar11 = xs_RoundToInt((real64)(CenterX + dVar19 * pspritexscale));
  if (viewwidth < iVar11) {
    return;
  }
  iVar8 = FTexture::GetScaledWidth((FTexture *)vis);
  local_f8 = xs_RoundToInt((real64)(CenterX + ((double)iVar8 + dVar19) * pspritexscale));
  if (local_f8 < 1) {
    return;
  }
  pvStack_80 = TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::operator[]
                         (&R_DrawPSprite::avis,(ulong)vispspindex);
  uVar9 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&owner->renderflags);
  pvStack_80->renderflags = (short)uVar9;
  pvStack_80->floorclip = 0.0;
  (pvStack_80->field_14).field_0.texturemid =
       (100.0 - (double)sprdef) * (vis->Angle).Degrees +
       (double)(int)*(short *)((long)&(vis->gpos).Y + 2);
  iVar8 = viewheight;
  if ((camera->player != (player_t *)0x0) &&
     ((((DFrameBuffer *)RenderTarget != screen ||
       (iVar12 = DCanvas::GetHeight(RenderTarget), iVar8 == iVar12)) ||
      ((iVar8 = DCanvas::GetWidth(RenderTarget), 0x140 < iVar8 &&
       (bVar7 = FBoolCVar::operator_cast_to_bool(&st_scale), !bVar7)))))) {
    p = DPSprite::GetCaller(pspr);
    colormap_to_use = (FDynamicColormap *)dyn_cast<AWeapon>((DObject *)p);
    iVar8 = viewheight;
    if (((AWeapon *)colormap_to_use != (AWeapon *)0x0) &&
       ((((AWeapon *)colormap_to_use)->YAdjust != 0.0 ||
        (NAN(((AWeapon *)colormap_to_use)->YAdjust))))) {
      if (((DFrameBuffer *)RenderTarget == screen) &&
         (iVar12 = DCanvas::GetHeight(RenderTarget), iVar8 != iVar12)) {
        dVar19 = DBaseStatusBar::GetDisplacement(StatusBar);
        (pvStack_80->field_14).field_0.texturemid =
             (pvStack_80->field_14).field_0.texturemid -
             dVar19 * (double)(float)colormap_to_use[0x29].Fade.field_0;
      }
      else {
        (pvStack_80->field_14).field_0.texturemid =
             (pvStack_80->field_14).field_0.texturemid -
             (double)(float)colormap_to_use[0x29].Fade.field_0;
      }
    }
  }
  iVar8 = DPSprite::GetID(pspr);
  if (iVar8 < 0x7ffffffd) {
    dVar19 = AspectPspriteOffset(WidescreenRatio);
    (pvStack_80->field_14).field_0.texturemid = (pvStack_80->field_14).field_0.texturemid - dVar19;
  }
  local_f4 = iVar11;
  if (iVar11 < 0) {
    local_f4 = 0;
  }
  pvStack_80->x1 = (short)local_f4;
  if (viewwidth <= local_f8) {
    local_f8 = viewwidth;
  }
  pvStack_80->x2 = (short)local_f8;
  fVar13 = FloatToFixed(pspritexscale / (double)vis->field_3);
  pvStack_80->xscale = fVar13;
  pvStack_80->yscale = (float)(pspriteyscale / (vis->Angle).Degrees);
  pvStack_80->Translation = 0;
  (pvStack_80->field_13).pic = (FTexture *)vis;
  pvStack_80->ColormapNum = '\0';
  if ((tex._2_2_ == 0) == ((pspr->Flags & 0x40U) == 0)) {
    fVar13 = FloatToFixed(pspritexiscale * (double)vis->field_3);
    (pvStack_80->field_14).field_0.xiscale = fVar13;
    (pvStack_80->field_14).field_0.startfrac = 0;
  }
  else {
    fVar13 = FloatToFixed(pspritexiscale * (double)vis->field_3);
    (pvStack_80->field_14).field_0.xiscale = -fVar13;
    iVar8 = FTexture::GetWidth((FTexture *)vis);
    (pvStack_80->field_14).field_0.startfrac = iVar8 * 0x10000 + -1;
  }
  if (iVar11 < pvStack_80->x1) {
    (pvStack_80->field_14).field_0.startfrac =
         (pvStack_80->field_14).field_0.xiscale * (pvStack_80->x1 - iVar11) +
         (pvStack_80->field_14).field_0.startfrac;
  }
  local_81 = 0;
  pFStack_a8 = (FDynamicColormap *)0x0;
  iVar8 = DPSprite::GetID(pspr);
  if (0x7ffffffc < iVar8) {
    pFStack_a8 = basecolormap;
    (pvStack_80->Style).colormap = basecolormap->Maps;
    FRenderStyle::operator=((FRenderStyle *)&(pvStack_80->Style).RenderStyle.field_0,STYLE_Normal);
    goto LAB_0038da16;
  }
  (pvStack_80->Style).Alpha = (float)owner->Alpha;
  (pvStack_80->Style).RenderStyle = owner->RenderStyle;
  bVar1 = (pvStack_80->Style).RenderStyle.field_0.Flags;
  mybasecolormap._4_4_ = bVar1 & 0x20;
  if (((pvStack_80->Style).RenderStyle.field_0.Flags & 0x10) != 0) {
    mybasecolormap._4_4_ = (uint)(((bVar1 & 0x20) != 0 ^ 0xffU) & 1);
  }
  local_b8 = basecolormap;
  if (((pvStack_80->Style).RenderStyle.field_0.Flags & 0x40) != 0) {
    if (mybasecolormap._4_4_ == 0) {
      local_c4 = (basecolormap->Color).field_0.field_0;
      PalEntry::PalEntry((PalEntry *)&local_c8.field_0,0);
      local_b8 = GetSpecialLights((PalEntry)local_c4,(PalEntry)local_c8,local_b8->Desaturate);
    }
    else {
      local_bc = (basecolormap->Color).field_0.field_0;
      PalEntry::PalEntry((PalEntry *)&local_c0.field_0,0xffffff);
      local_b8 = GetSpecialLights((PalEntry)local_bc,(PalEntry)local_c0,local_b8->Desaturate);
      mybasecolormap._4_4_ = 0;
    }
  }
  if (realfixedcolormap == 0) {
    if (mybasecolormap._4_4_ != 0) {
      oldcolormap._4_4_ = (local_b8->Color).field_0.field_0;
      oldcolormap._0_4_ =
           (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
           PalEntry::InverseColor(&local_b8->Fade);
      local_b8 = GetSpecialLights((PalEntry)oldcolormap._4_4_,(PalEntry)oldcolormap._0_4_,
                                  local_b8->Desaturate);
    }
    if (fixedlightlev < 0) {
      if ((foggy & 1) == 0) {
        pFVar17 = DPSprite::GetState(pspr);
        iVar8 = FState::GetFullbright(pFVar17);
        if (iVar8 != 0) {
          bVar7 = FBoolCVar::operator_cast_to_bool(&r_fullbrightignoresectorcolor);
          if (bVar7) {
            local_108 = FullNormalLight.Maps;
          }
          else {
            local_108 = local_b8->Maps;
          }
          (pvStack_80->Style).colormap = local_108;
          goto LAB_0038d743;
        }
      }
      iVar8 = spriteshade;
      pBVar3 = local_b8->Maps;
      dVar19 = MIN<double>(24.0,0.0);
      fVar13 = FloatToFixed(dVar19);
      iVar8 = clamp<int>(iVar8 - fVar13 >> 0x10,0,0x1f);
      (pvStack_80->Style).colormap = pBVar3 + (iVar8 << 8);
    }
    else {
      bVar7 = FBoolCVar::operator_cast_to_bool(&r_fullbrightignoresectorcolor);
      if (bVar7) {
        local_100 = FullNormalLight.Maps + fixedlightlev;
      }
      else {
        local_100 = local_b8->Maps + fixedlightlev;
      }
      (pvStack_80->Style).colormap = local_100;
    }
  }
  else {
    (pvStack_80->Style).colormap = (lighttable_t *)(realfixedcolormap + 0x18);
  }
LAB_0038d743:
  bVar7 = TObjPtr<AInventory>::operator!=(&camera->Inventory,(AInventory *)0x0);
  if (bVar7) {
    plStack_d8 = (pvStack_80->Style).colormap;
    pAVar15 = TObjPtr<AInventory>::operator->(&camera->Inventory);
    (*(pAVar15->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2e])
              (pAVar15,&pvStack_80->Style);
    if ((pvStack_80->Style).colormap != plStack_d8) {
      plVar4 = (pvStack_80->Style).colormap;
      pFVar16 = TArray<FSpecialColormap,_FSpecialColormap>::operator[](&SpecialColormaps,0);
      if ((plVar4 < pFVar16->Colormap) ||
         (plVar4 = (pvStack_80->Style).colormap,
         pFVar16 = TArray<FSpecialColormap,_FSpecialColormap>::Last(&SpecialColormaps),
         pFVar16->Colormap < plVar4)) {
        local_81 = 1;
      }
      else if (((pvStack_80->Style).colormap < local_b8->Maps) ||
              (local_b8->Maps + 0x2000 <= (pvStack_80->Style).colormap)) {
        local_81 = 1;
      }
    }
  }
  bVar7 = FBoolCVar::operator_cast_to_bool(&r_shadercolormaps);
  if (((!bVar7) &&
      (plVar4 = (pvStack_80->Style).colormap,
      pFVar16 = TArray<FSpecialColormap,_FSpecialColormap>::operator[](&SpecialColormaps,0),
      pFVar16->Colormap <= plVar4)) &&
     (plVar4 = (pvStack_80->Style).colormap,
     pFVar16 = TArray<FSpecialColormap,_FSpecialColormap>::Last(&SpecialColormaps),
     plVar4 <= pFVar16->Colormap)) {
    local_81 = 1;
  }
  if ((local_b8 == &NormalLight) && (NormalLight.Maps != realcolormaps)) {
    local_81 = 1;
  }
  if ((((local_81 & 1) == 0) && (realfixedcolormap == 0)) &&
     (((NormalLightHasFixedLights & 1U) != 0 &&
      ((local_b8 == &NormalLight &&
       (uVar9 = (*((pvStack_80->field_13).pic)->_vptr_FTexture[5])(), (uVar9 & 1) != 0)))))) {
    local_81 = 1;
  }
  bVar7 = FBoolCVar::operator_cast_to_bool(&r_fullbrightignoresectorcolor);
  if ((bVar7) && (-1 < fixedlightlev)) {
    local_b8 = &FullNormalLight;
  }
  bVar7 = FBoolCVar::operator_cast_to_bool(&r_fullbrightignoresectorcolor);
  if ((bVar7) && ((foggy & 1) == 0)) {
    pFVar17 = DPSprite::GetState(pspr);
    iVar8 = FState::GetFullbright(pFVar17);
    if (iVar8 != 0) {
      local_b8 = &FullNormalLight;
    }
  }
  pFStack_a8 = local_b8;
LAB_0038da16:
  if ((((local_81 & 1) == 0) && ((DFrameBuffer *)RenderTarget == screen)) &&
     ((screen->Accel2D & 1U) != 0)) {
    local_dc = (pvStack_80->Style).RenderStyle.field_0;
    FRenderStyle::CheckFuzz((FRenderStyle *)&local_dc);
    if (local_dc.BlendOp != '\x04') {
      uVar9 = TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::Size
                        ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites);
      if (uVar9 < vispspindex + 1) {
        uVar9 = TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::Size
                          ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites);
        TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::Reserve
                  ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites,
                   (uVar9 - vispspindex) + 1);
      }
      pvVar6 = pvStack_80;
      pvVar18 = TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::operator[]
                          ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites,
                           (ulong)vispspindex);
      pFVar5 = pFStack_a8;
      pvVar18->vis = pvVar6;
      pvVar18 = TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::operator[]
                          ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites,
                           (ulong)vispspindex);
      pvVar18->basecolormap = pFVar5;
      pvVar18 = TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::operator[]
                          ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites,
                           (ulong)vispspindex);
      pvVar18->x1 = iVar11;
      vispspindex = vispspindex + 1;
      return;
    }
  }
  R_DrawVisSprite(pvStack_80);
  return;
}

Assistant:

void R_DrawPSprite(DPSprite *pspr, AActor *owner, float bobx, float boby, double wx, double wy, double ticfrac)
{
	double 				tx;
	int 				x1;
	int 				x2;
	double				sx, sy;
	spritedef_t*		sprdef;
	spriteframe_t*		sprframe;
	FTextureID			picnum;
	WORD				flip;
	FTexture*			tex;
	vissprite_t*		vis;
	bool				noaccel;
	static TArray<vissprite_t> avis;

	if (avis.Size() < vispspindex + 1)
		avis.Reserve(avis.Size() - vispspindex + 1);

	// decide which patch to use
	if ((unsigned)pspr->GetSprite() >= (unsigned)sprites.Size())
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite number %i\n", pspr->GetSprite());
		return;
	}
	sprdef = &sprites[pspr->GetSprite()];
	if (pspr->GetFrame() >= sprdef->numframes)
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite frame %i : %i\n", pspr->GetSprite(), pspr->GetFrame());
		return;
	}
	sprframe = &SpriteFrames[sprdef->spriteframes + pspr->GetFrame()];

	picnum = sprframe->Texture[0];
	flip = sprframe->Flip & 1;
	tex = TexMan(picnum);

	if (tex->UseType == FTexture::TEX_Null)
		return;

	if (pspr->firstTic)
	{ // Can't interpolate the first tic.
		pspr->firstTic = false;
		pspr->oldx = pspr->x;
		pspr->oldy = pspr->y;
	}

	sx = pspr->oldx + (pspr->x - pspr->oldx) * ticfrac;
	sy = pspr->oldy + (pspr->y - pspr->oldy) * ticfrac + WEAPON_FUDGE_Y;

	if (pspr->Flags & PSPF_ADDBOB)
	{
		sx += bobx;
		sy += boby;
	}

	if (pspr->Flags & PSPF_ADDWEAPON && pspr->GetID() != PSP_WEAPON)
	{
		sx += wx;
		sy += wy;
	}

	// calculate edges of the shape
	tx = sx - BASEXCENTER;

	tx -= tex->GetScaledLeftOffset();
	x1 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the right side
	if (x1 > viewwidth)
		return;

	tx += tex->GetScaledWidth();
	x2 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the left side
	if (x2 <= 0)
		return;

	// store information in a vissprite
	vis = &avis[vispspindex];
	vis->renderflags = owner->renderflags;
	vis->floorclip = 0;

	vis->texturemid = (BASEYCENTER - sy) * tex->Scale.Y + tex->TopOffset;

	if (camera->player && (RenderTarget != screen ||
		viewheight == RenderTarget->GetHeight() ||
		(RenderTarget->GetWidth() > (BASEXCENTER * 2) && !st_scale)))
	{	// Adjust PSprite for fullscreen views
		AWeapon *weapon = dyn_cast<AWeapon>(pspr->GetCaller());
		if (weapon != nullptr && weapon->YAdjust != 0)
		{
			if (RenderTarget != screen || viewheight == RenderTarget->GetHeight())
			{
				vis->texturemid -= weapon->YAdjust;
			}
			else
			{
				vis->texturemid -= StatusBar->GetDisplacement() * weapon->YAdjust;
			}
		}
	}
	if (pspr->GetID() < PSP_TARGETCENTER)
	{ // Move the weapon down for 1280x1024.
		vis->texturemid -= AspectPspriteOffset(WidescreenRatio);
	}
	vis->x1 = x1 < 0 ? 0 : x1;
	vis->x2 = x2 >= viewwidth ? viewwidth : x2;
	vis->xscale = FLOAT2FIXED(pspritexscale / tex->Scale.X);
	vis->yscale = float(pspriteyscale / tex->Scale.Y);
	vis->Translation = 0;		// [RH] Use default colors
	vis->pic = tex;
	vis->ColormapNum = 0;

	if (!(flip) != !(pspr->Flags & PSPF_FLIP))
	{
		vis->xiscale = -FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = (tex->GetWidth() << FRACBITS) - 1;
	}
	else
	{
		vis->xiscale = FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = 0;
	}

	if (vis->x1 > x1)
		vis->startfrac += vis->xiscale*(vis->x1 - x1);

	noaccel = false;
	FDynamicColormap *colormap_to_use = nullptr;
	if (pspr->GetID() < PSP_TARGETCENTER)
	{
		vis->Style.Alpha = float(owner->Alpha);
		vis->Style.RenderStyle = owner->RenderStyle;

		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertcolormap = (vis->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

		if (vis->Style.RenderStyle.Flags & STYLEF_InvertSource)
		{
			invertcolormap = !invertcolormap;
		}

		FDynamicColormap *mybasecolormap = basecolormap;

		if (vis->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
		{
			if (invertcolormap)
			{ // Fade to white
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255, 255, 255), mybasecolormap->Desaturate);
				invertcolormap = false;
			}
			else
			{ // Fade to black
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0, 0, 0), mybasecolormap->Desaturate);
			}
		}

		if (realfixedcolormap != nullptr)
		{ // fixed color
			vis->Style.colormap = realfixedcolormap->Colormap;
		}
		else
		{
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				vis->Style.colormap = (r_fullbrightignoresectorcolor) ? (FullNormalLight.Maps + fixedlightlev) : (mybasecolormap->Maps + fixedlightlev);
			}
			else if (!foggy && pspr->GetState()->GetFullbright())
			{ // full bright
				vis->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : mybasecolormap->Maps;	// [RH] use basecolormap
			}
			else
			{ // local light
				vis->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(0, spriteshade) << COLORMAPSHIFT);
			}
		}
		if (camera->Inventory != nullptr)
		{
			lighttable_t *oldcolormap = vis->Style.colormap;
			camera->Inventory->AlterWeaponSprite(&vis->Style);
			if (vis->Style.colormap != oldcolormap)
			{
				// The colormap has changed. Is it one we can easily identify?
				// If not, then don't bother trying to identify it for
				// hardware accelerated drawing.
				if (vis->Style.colormap < SpecialColormaps[0].Colormap ||
					vis->Style.colormap > SpecialColormaps.Last().Colormap)
				{
					noaccel = true;
				}
				// Has the basecolormap changed? If so, we can't hardware accelerate it,
				// since we don't know what it is anymore.
				else if (vis->Style.colormap < mybasecolormap->Maps ||
					vis->Style.colormap >= mybasecolormap->Maps + NUMCOLORMAPS * 256)
				{
					noaccel = true;
				}
			}
		}
		// If we're drawing with a special colormap, but shaders for them are disabled, do
		// not accelerate.
		if (!r_shadercolormaps && (vis->Style.colormap >= SpecialColormaps[0].Colormap &&
			vis->Style.colormap <= SpecialColormaps.Last().Colormap))
		{
			noaccel = true;
		}
		// If drawing with a BOOM colormap, disable acceleration.
		if (mybasecolormap == &NormalLight && NormalLight.Maps != realcolormaps)
		{
			noaccel = true;
		}
		// If the main colormap has fixed lights, and this sprite is being drawn with that
		// colormap, disable acceleration so that the lights can remain fixed.
		if (!noaccel && realfixedcolormap == nullptr &&
			NormalLightHasFixedLights && mybasecolormap == &NormalLight &&
			vis->pic->UseBasePalette())
		{
			noaccel = true;
		}
		// [SP] If emulating GZDoom fullbright, disable acceleration
		if (r_fullbrightignoresectorcolor && fixedlightlev >= 0)
			mybasecolormap = &FullNormalLight;
		if (r_fullbrightignoresectorcolor && !foggy && pspr->GetState()->GetFullbright())
			mybasecolormap = &FullNormalLight;
		colormap_to_use = mybasecolormap;
	}
	else
	{
		colormap_to_use = basecolormap;
		vis->Style.colormap = basecolormap->Maps;
		vis->Style.RenderStyle = STYLE_Normal;
	}

	// Check for hardware-assisted 2D. If it's available, and this sprite is not
	// fuzzy, don't draw it until after the switch to 2D mode.
	if (!noaccel && RenderTarget == screen && (DFrameBuffer *)screen->Accel2D)
	{
		FRenderStyle style = vis->Style.RenderStyle;
		style.CheckFuzz();
		if (style.BlendOp != STYLEOP_Fuzz)
		{
			if (vispsprites.Size() < vispspindex + 1)
				vispsprites.Reserve(vispsprites.Size() - vispspindex + 1);

			vispsprites[vispspindex].vis = vis;
			vispsprites[vispspindex].basecolormap = colormap_to_use;
			vispsprites[vispspindex].x1 = x1;
			vispspindex++;
			return;
		}
	}
	R_DrawVisSprite(vis);
}